

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convex_hull.cpp
# Opt level: O1

vector<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
* ear::convex_hull(vector<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
                   *__return_storage_ptr__,
                  vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                  *positions,double tolerance)

{
  double *pdVar1;
  double dVar2;
  _Rb_tree_color _Var3;
  bool bVar4;
  array<unsigned_long,_3UL> *paVar5;
  Matrix<double,_3,_1,_0,_3,_1> *pos_1;
  long lVar6;
  pointer pMVar7;
  internal_error *this;
  pointer pMVar8;
  pointer psVar9;
  bool bVar10;
  Matrix<double,_3,_1,_0,_3,_1> *pos;
  pointer pMVar11;
  _Base_ptr p_Var12;
  _Base_ptr p_Var13;
  Matrix<double,_3,_1,_0,_3,_1> *pMVar14;
  ulong uVar15;
  _Base_ptr p_Var16;
  vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  *__range1;
  double dVar17;
  ulong in_XMM0_Qb;
  undefined1 auVar18 [16];
  double dVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  double dVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  double dVar28;
  vector<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
  *hull_facets;
  vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  hull_facet_normals;
  type rhs;
  vector<std::array<unsigned_long,_3UL>,_std::allocator<std::array<unsigned_long,_3UL>_>_> hull_tris
  ;
  vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  hull_tri_normals;
  Facet f;
  Matrix<double,_3,_1,_0,_3,_1> local_108;
  Matrix<double,_3,_1,_0,_3,_1> *local_e8;
  int local_dc;
  array<unsigned_long,_3UL> *local_d8;
  iterator iStack_d0;
  array<unsigned_long,_3UL> *local_c8;
  _Base_ptr local_c0;
  void *local_b8;
  iterator iStack_b0;
  Matrix<double,_3,_1,_0,_3,_1> *local_a8;
  undefined1 local_98 [8];
  undefined1 auStack_90 [24];
  _Base_ptr local_78;
  size_t local_70;
  double local_68;
  ulong uStack_60;
  double local_58;
  undefined1 local_48 [16];
  _Base_ptr local_38;
  
  pMVar7 = (positions->
           super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pMVar8 = (positions->
           super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (pMVar7 == pMVar8) {
    local_e8 = (Matrix<double,_3,_1,_0,_3,_1> *)0x0;
    auVar22 = ZEXT816(0);
  }
  else {
    auVar22 = ZEXT816(0);
    local_e8 = (Matrix<double,_3,_1,_0,_3,_1> *)0x0;
    pMVar11 = pMVar7;
    do {
      auVar18 = *(undefined1 (*) [16])
                 (pMVar11->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
                 m_data.array;
      dVar26 = auVar22._8_8_;
      auVar22._0_8_ = auVar22._0_8_ + auVar18._0_8_;
      auVar22._8_8_ = dVar26 + auVar18._8_8_;
      local_e8 = (Matrix<double,_3,_1,_0,_3,_1> *)
                 ((double)local_e8 +
                 (pMVar11->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
                 m_data.array[2]);
      pMVar11 = pMVar11 + 1;
    } while (pMVar11 != pMVar8);
  }
  local_d8 = (array<unsigned_long,_3UL> *)0x0;
  iStack_d0._M_current = (array<unsigned_long,_3UL> *)0x0;
  local_c8 = (array<unsigned_long,_3UL> *)0x0;
  local_a8 = (Matrix<double,_3,_1,_0,_3,_1> *)0x0;
  local_b8 = (void *)0x0;
  iStack_b0._M_current = (Matrix<double,_3,_1,_0,_3,_1> *)0x0;
  local_58 = tolerance;
  if ((positions->
      super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
      )._M_impl.super__Vector_impl_data._M_finish !=
      (positions->
      super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
      )._M_impl.super__Vector_impl_data._M_start) {
    lVar6 = ((long)pMVar8 - (long)pMVar7 >> 3) * -0x5555555555555555;
    auVar18._8_4_ = (int)((ulong)lVar6 >> 0x20);
    auVar18._0_8_ = lVar6;
    auVar18._12_4_ = 0x45300000;
    auVar20._0_8_ =
         (auVar18._8_8_ - 1.9342813113834067e+25) +
         ((double)CONCAT44(0x43300000,(int)lVar6) - 4503599627370496.0);
    local_e8 = (Matrix<double,_3,_1,_0,_3,_1> *)((double)local_e8 / auVar20._0_8_);
    auVar20._8_8_ = auVar20._0_8_;
    local_48 = divpd(auVar22,auVar20);
    local_68 = -tolerance;
    uStack_60 = in_XMM0_Qb ^ 0x8000000000000000;
    p_Var12 = (_Base_ptr)0x0;
    do {
      local_38 = (_Base_ptr)((long)&p_Var12->_M_color + 1);
      p_Var16 = local_38;
      if (local_38 <
          (_Base_ptr)
          (((long)(positions->
                  super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                  )._M_impl.super__Vector_impl_data._M_finish -
            (long)(positions->
                  super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                  )._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555)) {
        do {
          p_Var13 = (_Base_ptr)((long)&p_Var16->_M_color + 1);
          pMVar7 = (positions->
                   super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          pMVar8 = (positions->
                   super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish;
          local_c0 = p_Var13;
          if (p_Var13 < (_Base_ptr)(((long)pMVar8 - (long)pMVar7 >> 3) * -0x5555555555555555)) {
            do {
              dVar26 = pMVar7[(long)p_Var12].
                       super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data
                       .array[0];
              dVar28 = pMVar7[(long)p_Var12].
                       super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data
                       .array[1];
              dVar19 = pMVar7[(long)p_Var16].
                       super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data
                       .array[1] - dVar28;
              dVar24 = pMVar7[(long)p_Var12].
                       super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data
                       .array[2];
              dVar25 = pMVar7[(long)p_Var13].
                       super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data
                       .array[2] - dVar24;
              dVar24 = pMVar7[(long)p_Var16].
                       super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data
                       .array[2] - dVar24;
              dVar28 = pMVar7[(long)p_Var13].
                       super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data
                       .array[1] - dVar28;
              dVar17 = pMVar7[(long)p_Var16].
                       super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data
                       .array[0] - dVar26;
              local_108.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
              m_data.array[0] = dVar19 * dVar25 - dVar28 * dVar24;
              dVar26 = pMVar7[(long)p_Var13].
                       super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data
                       .array[0] - dVar26;
              local_108.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
              m_data.array[1] = dVar24 * dVar26 - dVar25 * dVar17;
              local_108.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
              m_data.array[2] = dVar17 * dVar28 - dVar26 * dVar19;
              auVar21._0_8_ =
                   local_108.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                   m_data.array[2] *
                   local_108.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                   m_data.array[2] +
                   local_108.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                   m_data.array[1] *
                   local_108.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                   m_data.array[1] +
                   local_108.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                   m_data.array[0] *
                   local_108.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                   m_data.array[0];
              if (auVar21._0_8_ <= local_58) {
                this = (internal_error *)__cxa_allocate_exception(0x10);
                local_98 = (undefined1  [8])(auStack_90 + 8);
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)local_98,"collinear points in convex hull","");
                internal_error::internal_error(this,(string *)local_98);
                __cxa_throw(this,&internal_error::typeinfo,std::runtime_error::~runtime_error);
              }
              if (0.0 < auVar21._0_8_) {
                auVar21._8_8_ = 0;
                auVar22 = sqrtpd(auVar21,auVar21);
                auVar23._0_8_ = auVar22._0_8_;
                local_108.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                m_data.array[2] =
                     local_108.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                     m_storage.m_data.array[2] / auVar23._0_8_;
                auVar23._8_8_ = auVar23._0_8_;
                local_108.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                m_data.array._0_16_ =
                     divpd((undefined1  [16])
                           local_108.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                           m_storage.m_data.array._0_16_,auVar23);
              }
              auVar22 = *(undefined1 (*) [16])
                         pMVar7[(long)p_Var12].
                         super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                         m_data.array;
              dVar28 = auVar22._0_8_;
              dVar24 = auVar22._8_8_;
              dVar26 = pMVar7[(long)p_Var12].
                       super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data
                       .array[2];
              dVar17 = ((double)local_e8 - dVar26) *
                       local_108.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                       m_storage.m_data.array[2] +
                       ((double)local_48._8_8_ - dVar24) *
                       local_108.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                       m_storage.m_data.array[1] +
                       ((double)local_48._0_8_ - dVar28) *
                       local_108.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                       m_storage.m_data.array[0];
              if (local_58 <= ABS(dVar17)) {
                if (pMVar7 != pMVar8) {
                  bVar10 = true;
                  do {
                    dVar19 = ((pMVar7->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>)
                              .m_storage.m_data.array[2] - dVar26) *
                             local_108.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                             m_storage.m_data.array[2] +
                             ((pMVar7->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>)
                              .m_storage.m_data.array[1] - dVar24) *
                             local_108.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                             m_storage.m_data.array[1] +
                             ((pMVar7->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>)
                              .m_storage.m_data.array[0] - dVar28) *
                             local_108.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                             m_storage.m_data.array[0];
                    if (dVar17 <= 0.0) {
                      if (dVar19 < local_58) goto LAB_0016f730;
LAB_0016f743:
                      bVar4 = true;
                      bVar10 = false;
                    }
                    else {
                      if (dVar19 <= local_68) goto LAB_0016f743;
LAB_0016f730:
                      bVar4 = false;
                    }
                  } while ((!bVar4) && (pMVar7 = pMVar7 + 1, pMVar7 != pMVar8));
                  if (!bVar10) goto LAB_0016f7ec;
                }
                local_98 = (undefined1  [8])p_Var12;
                auStack_90._0_8_ = p_Var16;
                auStack_90._8_8_ = p_Var13;
                if (iStack_d0._M_current == local_c8) {
                  std::
                  vector<std::array<unsigned_long,3ul>,std::allocator<std::array<unsigned_long,3ul>>>
                  ::_M_realloc_insert<std::array<unsigned_long,3ul>>
                            ((vector<std::array<unsigned_long,3ul>,std::allocator<std::array<unsigned_long,3ul>>>
                              *)&local_d8,iStack_d0,(array<unsigned_long,_3UL> *)local_98);
                }
                else {
                  (iStack_d0._M_current)->_M_elems[2] = (unsigned_long)p_Var13;
                  (iStack_d0._M_current)->_M_elems[0] = (unsigned_long)p_Var12;
                  (iStack_d0._M_current)->_M_elems[1] = (unsigned_long)p_Var16;
                  iStack_d0._M_current = iStack_d0._M_current + 1;
                }
                if (iStack_b0._M_current == local_a8) {
                  std::
                  vector<Eigen::Matrix<double,3,1,0,3,1>,std::allocator<Eigen::Matrix<double,3,1,0,3,1>>>
                  ::_M_realloc_insert<Eigen::Matrix<double,3,1,0,3,1>const&>
                            ((vector<Eigen::Matrix<double,3,1,0,3,1>,std::allocator<Eigen::Matrix<double,3,1,0,3,1>>>
                              *)&local_b8,iStack_b0,&local_108);
                }
                else {
                  ((iStack_b0._M_current)->
                  super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.
                  array[2] = local_108.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                             m_storage.m_data.array[2];
                  ((iStack_b0._M_current)->
                  super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.
                  array[0] = local_108.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                             m_storage.m_data.array[0];
                  ((iStack_b0._M_current)->
                  super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.
                  array[1] = local_108.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                             m_storage.m_data.array[1];
                  iStack_b0._M_current = iStack_b0._M_current + 1;
                }
              }
LAB_0016f7ec:
              p_Var13 = (_Base_ptr)((long)&p_Var13->_M_color + 1);
              pMVar7 = (positions->
                       super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                       )._M_impl.super__Vector_impl_data._M_start;
              pMVar8 = (positions->
                       super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                       )._M_impl.super__Vector_impl_data._M_finish;
            } while (p_Var13 < (_Base_ptr)(((long)pMVar8 - (long)pMVar7 >> 3) * -0x5555555555555555)
                    );
          }
          p_Var16 = local_c0;
        } while (local_c0 <
                 (_Base_ptr)
                 (((long)(positions->
                         super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                         )._M_impl.super__Vector_impl_data._M_finish -
                   (long)(positions->
                         super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                         )._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555));
      }
      p_Var12 = local_38;
    } while (local_38 <
             (_Base_ptr)
             (((long)(positions->
                     super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                     )._M_impl.super__Vector_impl_data._M_finish -
               (long)(positions->
                     super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                     )._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555));
  }
  (__return_storage_ptr__->
  super__Vector_base<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_108.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] =
       0.0;
  local_108.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array.
  _0_16_ = ZEXT816(0);
  if (iStack_d0._M_current != local_d8) {
    local_68 = 0.0;
    p_Var12 = (_Base_ptr)0x0;
    do {
      pMVar14 = (Matrix<double,_3,_1,_0,_3,_1> *)((long)local_b8 + (long)p_Var12 * 0x18);
      psVar9 = (__return_storage_ptr__->
               super__Vector_base<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      local_e8 = pMVar14;
      local_c0 = p_Var12;
      if ((__return_storage_ptr__->
          super__Vector_base<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
          )._M_impl.super__Vector_impl_data._M_finish == psVar9) {
LAB_0016fa5b:
        dVar26 = local_68;
        paVar5 = local_d8;
        auStack_90._0_8_ = auStack_90._0_8_ & 0xffffffff00000000;
        auStack_90._8_8_ = (_Base_ptr)0x0;
        auStack_90._16_8_ = auStack_90;
        local_70 = 0;
        lVar6 = 0;
        local_78 = (_Base_ptr)auStack_90._16_8_;
        do {
          local_dc = *(int *)((long)paVar5->_M_elems + lVar6 + (long)dVar26);
          std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
          _M_insert_unique<int>
                    ((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>
                      *)local_98,&local_dc);
          lVar6 = lVar6 + 8;
        } while (lVar6 != 0x18);
        std::
        vector<std::set<int,std::less<int>,std::allocator<int>>,std::allocator<std::set<int,std::less<int>,std::allocator<int>>>>
        ::emplace_back<std::set<int,std::less<int>,std::allocator<int>>>
                  ((vector<std::set<int,std::less<int>,std::allocator<int>>,std::allocator<std::set<int,std::less<int>,std::allocator<int>>>>
                    *)__return_storage_ptr__,
                   (set<int,_std::less<int>,_std::allocator<int>_> *)local_98);
        if (local_108.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
            array[1] ==
            local_108.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
            array[2]) {
          std::
          vector<Eigen::Matrix<double,3,1,0,3,1>,std::allocator<Eigen::Matrix<double,3,1,0,3,1>>>::
          _M_realloc_insert<Eigen::Matrix<double,3,1,0,3,1>const&>
                    ((vector<Eigen::Matrix<double,3,1,0,3,1>,std::allocator<Eigen::Matrix<double,3,1,0,3,1>>>
                      *)&local_108,
                     (iterator)
                     local_108.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                     m_storage.m_data.array[1],local_e8);
        }
        else {
          (((PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
           local_108.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
           array[1])->m_storage).m_data.array[2] =
               (local_e8->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
               m_data.array[2];
          dVar26 = (local_e8->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
                   m_storage.m_data.array[1];
          (((PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
           local_108.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
           array[1])->m_storage).m_data.array[0] =
               (local_e8->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
               m_data.array[0];
          (((PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
           local_108.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
           array[1])->m_storage).m_data.array[1] = dVar26;
          local_108.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
          array[1] = (double)((long)local_108.
                                    super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                                    m_storage.m_data.array[1] + 0x18);
        }
        std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
        ~_Rb_tree((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *)
                  local_98);
      }
      else {
        pMVar7 = (positions->
                 super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                 )._M_impl.super__Vector_impl_data._M_start + local_d8[(long)p_Var12]._M_elems[0];
        bVar10 = false;
        uVar15 = 0;
        local_48._0_8_ = pMVar7;
        do {
          dVar28 = local_68;
          paVar5 = local_d8;
          _Var3 = psVar9[uVar15]._M_t._M_impl.super__Rb_tree_header._M_header._M_left[1]._M_color;
          pMVar11 = (positions->
                    super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                    )._M_impl.super__Vector_impl_data._M_start;
          pMVar8 = pMVar11 + (int)_Var3;
          pdVar1 = (double *)
                   ((long)local_108.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                          m_storage.m_data.array[0] + uVar15 * 0x18);
          dVar26 = *(double *)
                    ((long)local_108.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                           m_storage.m_data.array[0] + 0x10 + uVar15 * 0x18);
          bVar4 = true;
          if ((ABS((*(double *)
                     ((long)&(pMVar7->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
                             m_storage.m_data + 0x10) -
                   *(double *)
                    ((long)&pMVar11[(int)_Var3].
                            super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                            m_data + 0x10)) * dVar26 +
                   pdVar1[1] *
                   (*(double *)
                     ((long)&(pMVar7->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
                             m_storage.m_data + 8) -
                   *(double *)
                    ((long)&(pMVar8->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
                            m_storage.m_data + 8)) +
                   *pdVar1 * ((pMVar7->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>)
                              .m_storage.m_data.array[0] -
                             (pMVar8->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
                             m_storage.m_data.array[0])) < local_58) &&
             (pdVar1 = (double *)
                       ((long)local_108.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
                              .m_storage.m_data.array[0] + uVar15 * 0x18), dVar24 = *pdVar1,
             dVar17 = pdVar1[1],
             dVar19 = (pMVar14->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
                      m_storage.m_data.array[2],
             dVar25 = (pMVar14->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
                      m_storage.m_data.array[0],
             dVar2 = (pMVar14->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
                     m_storage.m_data.array[1], dVar27 = dVar17 * dVar19 - dVar2 * dVar26,
             dVar19 = dVar26 * dVar25 - dVar19 * dVar24, dVar26 = dVar24 * dVar2 - dVar25 * dVar17,
             dVar26 * dVar26 + dVar19 * dVar19 + dVar27 * dVar27 < local_58)) {
            lVar6 = 0;
            do {
              local_98._0_4_ = *(undefined4 *)((long)paVar5->_M_elems + lVar6 + (long)dVar28);
              std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
              _M_insert_unique<int>
                        (&(__return_storage_ptr__->
                          super__Vector_base<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_start[uVar15]._M_t,(int *)local_98);
              lVar6 = lVar6 + 8;
            } while (lVar6 != 0x18);
            bVar10 = true;
            bVar4 = false;
            pMVar14 = local_e8;
            pMVar7 = (pointer)local_48._0_8_;
          }
          if (!bVar4) break;
          uVar15 = uVar15 + 1;
          psVar9 = (__return_storage_ptr__->
                   super__Vector_base<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
        } while (uVar15 < (ulong)(((long)(__return_storage_ptr__->
                                         super__Vector_base<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
                                         )._M_impl.super__Vector_impl_data._M_finish - (long)psVar9
                                  >> 4) * -0x5555555555555555));
        if (!bVar10) goto LAB_0016fa5b;
      }
      p_Var12 = (_Base_ptr)((long)&local_c0->_M_color + 1);
      local_68 = (double)((long)local_68 + 0x18);
    } while (p_Var12 < (_Base_ptr)
                       (((long)iStack_d0._M_current - (long)local_d8 >> 3) * -0x5555555555555555));
  }
  if ((void *)local_108.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
              m_data.array[0] != (void *)0x0) {
    operator_delete((void *)local_108.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                            m_storage.m_data.array[0],
                    (long)local_108.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                          m_storage.m_data.array[2] -
                    (long)local_108.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                          m_storage.m_data.array[0]);
  }
  if (local_b8 != (void *)0x0) {
    operator_delete(local_b8,(long)local_a8 - (long)local_b8);
  }
  if (local_d8 != (array<unsigned_long,_3UL> *)0x0) {
    operator_delete(local_d8,(long)local_c8 - (long)local_d8);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<Facet> convex_hull(const std::vector<Eigen::Vector3d> &positions,
                                 double tolerance) {
    using Vec = Eigen::Vector3d;
    using Tri = std::array<size_t, 3>;

    // the mean point, guaranteed to be inside the convex hull
    Vec inside_point = Vec::Zero();
    for (auto &pos : positions) inside_point += pos;
    inside_point /= (double)positions.size();

    // find all triangles on the convex hull:
    // - iterate through all possible triangles
    // - find the triangle normal, checking for collinearity
    // - it's on the convex hull if:
    //    - the inside point is not on the plane of the triangle
    //    - all points are on the same side of the plane of the triangle as the
    //    inside point
    std::vector<Tri> hull_tris;
    std::vector<Vec> hull_tri_normals;

    for (size_t i = 0; i < positions.size(); i++)
      for (size_t j = i + 1; j < positions.size(); j++)
        for (size_t k = j + 1; k < positions.size(); k++) {
          Vec normal =
              (positions[j] - positions[i]).cross(positions[k] - positions[i]);
          ear_assert(normal.squaredNorm() > tolerance,
                     "collinear points in convex hull");
          normal.normalize();  // XXX: not really required, but helps make
                               // tolerances consistent

          double dot_inside = normal.dot(inside_point - positions[i]);

          if (std::abs(dot_inside) < tolerance)
            continue;  // tri coplanar with inside point

          bool points_on_same_side_as_inside = true;
          for (auto &pos : positions) {
            double dot_point = normal.dot(pos - positions[i]);

            // check if signs are equal, with tolerance
            if (!(dot_inside > 0 ? dot_point > -tolerance
                                 : dot_point < tolerance)) {
              points_on_same_side_as_inside = false;
              break;
            }
          }

          if (points_on_same_side_as_inside) {
            hull_tris.push_back({i, j, k});
            hull_tri_normals.push_back(normal);
          }
        }

    // merge coplanar triangles into facets
    std::vector<Facet> hull_facets;
    std::vector<Vec> hull_facet_normals;

    for (size_t tri_i = 0; tri_i < hull_tris.size(); tri_i++) {
      const Vec &tri_point = positions[hull_tris[tri_i][0]];
      const Vec &tri_norm = hull_tri_normals[tri_i];

      // check each facet to see if this triangle is on the same plane.
      // if it is, add the points to the facet. if no facet is found, make a
      // new facet.
      bool found_facet = false;
      for (size_t facet_i = 0; facet_i < hull_facets.size(); facet_i++) {
        const Vec &facet_norm = hull_facet_normals[facet_i];
        const Vec &facet_point = positions[*hull_facets[facet_i].begin()];

        // they are on the same plane if the line between the test points is
        // not along the normal, and if the normals point in the same or
        // opposite direction. alternatively, we could just test all tri
        // vertices.
        if (std::abs((tri_point - facet_point).dot(facet_norm)) < tolerance &&
            facet_norm.cross(tri_norm).squaredNorm() < tolerance) {
          for (size_t corner_idx : hull_tris[tri_i]) {
            hull_facets[facet_i].insert((Facet::value_type)corner_idx);
          }

          found_facet = true;
          break;
        }
      }

      if (!found_facet) {
        Facet f;
        for (size_t corner_idx : hull_tris[tri_i])
          f.insert((Facet::value_type)corner_idx);
        hull_facets.push_back(std::move(f));
        hull_facet_normals.push_back(tri_norm);
      }
    }

    return hull_facets;
  }